

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnExport
          (BinaryReaderIR *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  char *pcVar1;
  Offset OVar2;
  size_t sVar3;
  tuple<wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_> tVar4;
  Location loc;
  __uniq_ptr_impl<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> local_a0;
  Location local_98;
  Var local_78;
  
  pcVar1 = this->filename_;
  sVar3 = strlen(pcVar1);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  tVar4.
  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
       operator_new(0xb0);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                  .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                  .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x10) = 0;
  *(size_t *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x18) = sVar3;
  *(char **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x20) =
       pcVar1;
  *(Offset *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x28) = OVar2;
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                  .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x38) = 3;
  *(undefined ***)
   tVar4.
   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
   super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       &PTR__ExportModuleField_0017d410;
  *(long **)((long)tVar4.
                   super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                   .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x40) =
       (long *)((long)tVar4.
                      super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                      .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x50);
  *(long *)((long)tVar4.
                  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                  .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x50) = 0;
  Var::Var((Var *)((long)tVar4.
                         super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                         .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl +
                  0x68));
  std::__cxx11::string::_M_replace
            ((ulong)((long)tVar4.
                           super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                           .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl +
                    0x40),0,
             *(char **)((long)tVar4.
                              super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                              .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl
                       + 0x48),(ulong)name._M_str);
  local_98.field_1.field_0.line = 0;
  local_98.field_1.field_0.first_column = 0;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = 0;
  local_98.filename._M_str._0_4_ = 0;
  local_98.filename._M_str._4_4_ = 0;
  pcVar1 = this->filename_;
  local_98.filename._M_len = strlen(pcVar1);
  local_98.filename._M_str._0_4_ = SUB84(pcVar1,0);
  local_98.filename._M_str._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.line = (int)OVar2;
  local_98.field_1.field_0.first_column = (int)(OVar2 >> 0x20);
  Var::Var(&local_78,item_index,&local_98);
  Var::operator=((Var *)((long)tVar4.
                               super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                               .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl
                        + 0x68),&local_78);
  Var::~Var(&local_78);
  *(ExternalKind *)
   ((long)tVar4.
          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 0x60) = kind;
  local_a0._M_t.
  super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>.
  super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl =
       (tuple<wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
       (tuple<wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
       tVar4.
       super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
       .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                       *)&local_a0);
  if ((_Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>)
      local_a0._M_t.
      super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
      .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl !=
      (ExportModuleField *)0x0) {
    (**(code **)(*(long *)local_a0._M_t.
                          super__Tuple_impl<0UL,_wabt::ExportModuleField_*,_std::default_delete<wabt::ExportModuleField>_>
                          .super__Head_base<0UL,_wabt::ExportModuleField_*,_false>._M_head_impl + 8)
    )();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnExport(Index index,
                                ExternalKind kind,
                                Index item_index,
                                std::string_view name) {
  auto field = std::make_unique<ExportModuleField>(GetLocation());
  Export& export_ = field->export_;
  export_.name = name;
  export_.var = Var(item_index, GetLocation());
  export_.kind = kind;
  module_->AppendField(std::move(field));
  return Result::Ok;
}